

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_base.hpp
# Opt level: O2

size_t jessilib::encode_codepoint_utf8<char,std::__cxx11::string>
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *out_destination
                 ,char32_t in_codepoint)

{
  byte bVar1;
  undefined8 uStack_20;
  
  if ((uint)in_codepoint < 0x110000) {
    if ((uint)in_codepoint < 0x80) {
      uStack_20 = 1;
    }
    else {
      bVar1 = (byte)in_codepoint;
      if ((uint)in_codepoint < 0x800) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (out_destination,(byte)((uint)in_codepoint >> 6) | 0xc0);
        in_codepoint = (char32_t)(bVar1 & 0x3f | 0x80);
        uStack_20 = 2;
      }
      else if ((uint)in_codepoint < 0x10000) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (out_destination,(byte)((uint)in_codepoint >> 0xc) | 0xe0);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (out_destination,(byte)((uint)in_codepoint >> 6) & 0x3f | 0x80);
        in_codepoint = (char32_t)(bVar1 & 0x3f | 0x80);
        uStack_20 = 3;
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (out_destination,(byte)((uint)in_codepoint >> 0x12) | 0xf0);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (out_destination,(byte)((uint)in_codepoint >> 0xc) & 0x3f | 0x80);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (out_destination,(byte)((uint)in_codepoint >> 6) & 0x3f | 0x80);
        in_codepoint = (char32_t)(bVar1 & 0x3f | 0x80);
        uStack_20 = 4;
      }
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (out_destination,(char)in_codepoint);
  }
  else {
    uStack_20 = 0;
  }
  return uStack_20;
}

Assistant:

constexpr size_t encode_codepoint_utf8(T& out_destination, char32_t in_codepoint) {
	if (in_codepoint > 0x10FFFF) {
		return 0;
	}

	if (in_codepoint <= 0x007F) {
		// 1-byte sequence (7 bits)
		impl_unicode::append_helper(out_destination, static_cast<CharT>(in_codepoint));
		return 1;
	}

	if (in_codepoint <= 0x07FF) {
		// 2-byte sequence (11 bits; 5 + 6)
		impl_unicode::append_helper(out_destination, static_cast<CharT>(0xC0 | ((in_codepoint >> 6) & 0x1F)));
		impl_unicode::append_helper(out_destination, static_cast<CharT>(0x80 | (in_codepoint & 0x3F)));
		return 2;
	}

	if (in_codepoint <= 0xFFFF) {
		// 3-byte sequence (16 bits; 4 + 6 + 6)
		impl_unicode::append_helper(out_destination, static_cast<CharT>(0xE0 | ((in_codepoint >> 12) & 0x0F)));
		impl_unicode::append_helper(out_destination, static_cast<CharT>(0x80 | ((in_codepoint >> 6) & 0x3F)));
		impl_unicode::append_helper(out_destination, static_cast<CharT>(0x80 | (in_codepoint & 0x3F)));
		return 3;
	}

	// 4-byte sequence (21 bits; 3 + 6 + 6 + 6)
	impl_unicode::append_helper(out_destination, static_cast<CharT>(0xF0 | ((in_codepoint >> 18) & 0x07)));
	impl_unicode::append_helper(out_destination, static_cast<CharT>(0x80 | ((in_codepoint >> 12) & 0x3F)));
	impl_unicode::append_helper(out_destination, static_cast<CharT>(0x80 | ((in_codepoint >> 6) & 0x3F)));
	impl_unicode::append_helper(out_destination, static_cast<CharT>(0x80 | (in_codepoint & 0x3F)));
	return 4;
}